

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O2

void free_tree(dtree_t *tr)

{
  dtree_node_t *ptr;
  void *pvVar1;
  uint32 i;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0x28;
  for (uVar2 = 0; ptr = tr->node, uVar2 < tr->n_node; uVar2 = uVar2 + 1) {
    pvVar1 = *(void **)((long)ptr + lVar3 + -0x10);
    if (pvVar1 != (void *)0x0) {
      ckd_free_3d(pvVar1);
    }
    pvVar1 = *(void **)((long)ptr + lVar3 + -8);
    if (pvVar1 != (void *)0x0) {
      ckd_free_3d(pvVar1);
    }
    pvVar1 = *(void **)((long)&ptr->node_id + lVar3);
    if (pvVar1 != (void *)0x0) {
      ckd_free_3d(pvVar1);
    }
    pvVar1 = *(void **)((long)ptr + lVar3 + -0x20);
    if (pvVar1 != (void *)0x0) {
      ckd_free(pvVar1);
    }
    lVar3 = lVar3 + 0x68;
  }
  ckd_free(ptr);
  ckd_free(tr);
  return;
}

Assistant:

void
free_tree(dtree_t *tr)
{
    uint32 i;
    dtree_node_t *node;

    for (i = 0; i < tr->n_node; i++) {
	node = &tr->node[i];

	if (node->mixw_occ)
	    ckd_free_3d((void ***)node->mixw_occ);
	if (node->means)
	    ckd_free_3d((void ***)node->means);
	if (node->vars)
	    ckd_free_3d((void ***)node->vars);
	if (node->id)
	    ckd_free(node->id);

	/* node->q not freed because if tr is a
	   simple tree, it points to the question
	   in the master list of questions that needs
	   to stick around */
    }

    ckd_free(tr->node);

    ckd_free(tr);
}